

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.h
# Opt level: O3

void Eigen::internal::ordering_helper_at_plus_a<Eigen::SparseMatrix<double,0,int>>
               (SparseMatrix<double,_0,_int> *A,SparseMatrix<double,_0,_int> *symmat)

{
  Index IVar1;
  StorageIndex *pSVar2;
  StorageIndex *pSVar3;
  Scalar *pSVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  SparseMatrix<double,_0,_int> C;
  SparseMatrix<double,_0,_int> local_98;
  SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> local_50 [8];
  SparseMatrix<double,_0,_int> *local_48;
  SparseMatrix<double,_0,_int> *local_40;
  
  local_98.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_98.m_outerSize = -1;
  local_98.m_innerSize = 0;
  local_98.m_outerIndex = (StorageIndex *)0x0;
  local_98.m_innerNonZeros = (StorageIndex *)0x0;
  local_98.m_data.m_values = (Scalar *)0x0;
  local_98.m_data.m_indices = (StorageIndex *)0x0;
  local_98.m_data.m_size = 0;
  local_98.m_data.m_allocatedSize = 0;
  SparseMatrix<double,_0,_int>::resize(&local_98,0,0);
  local_50[0].m_isRValue = false;
  local_48 = A;
  SparseMatrix<double,0,int>::operator=((SparseMatrix<double,0,int> *)&local_98,local_50);
  pSVar4 = local_98.m_data.m_values;
  pSVar3 = local_98.m_innerNonZeros;
  pSVar2 = local_98.m_outerIndex;
  IVar1 = local_98.m_innerSize;
  if (0 < local_98.m_innerSize) {
    lVar7 = 0;
    do {
      lVar5 = (long)pSVar2[lVar7];
      if (pSVar3 == (StorageIndex *)0x0) {
        lVar6 = (long)pSVar2[lVar7 + 1];
      }
      else {
        lVar6 = pSVar3[lVar7] + lVar5;
      }
      if (lVar6 - lVar5 != 0 && lVar5 <= lVar6) {
        memset(pSVar4 + lVar5,0,(lVar6 - lVar5) * 8);
      }
      lVar7 = lVar7 + 1;
    } while (IVar1 != lVar7);
  }
  local_50[0].m_isRValue = false;
  local_48 = &local_98;
  local_40 = A;
  SparseMatrix<double,0,int>::operator=
            ((SparseMatrix<double,0,int> *)symmat,
             (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
              *)local_50);
  free(local_98.m_outerIndex);
  free(local_98.m_innerNonZeros);
  CompressedStorage<double,_int>::~CompressedStorage(&local_98.m_data);
  return;
}

Assistant:

void ordering_helper_at_plus_a(const MatrixType& A, MatrixType& symmat)
{
  MatrixType C;
  C = A.transpose(); // NOTE: Could be  costly
  for (int i = 0; i < C.rows(); i++) 
  {
      for (typename MatrixType::InnerIterator it(C, i); it; ++it)
        it.valueRef() = 0.0;
  }
  symmat = C + A;
}